

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  allocator<char> local_15d;
  TestShaderType local_15c;
  ulong local_158;
  string example_structure_object;
  string local_130;
  string local_110 [32];
  string example_structure_definition;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string shader_source;
  string base_variable_string;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example_structure_definition,
             "struct light {\n    float intensity;\n    int position;\n};\n",
             (allocator<char> *)&example_structure_object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example_structure_object,"    light my_light_variable",
             (allocator<char> *)&base_variable_string);
  local_158 = (ulong)tested_shader_type;
  local_15c = tested_shader_type;
  std::__cxx11::string::string(local_110,(string *)&example_structure_object);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"[]",(allocator<char> *)&shader_source);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&base_variable_string,this,local_110,local_50,2);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"light",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"1.0, 2",&local_15d);
  recursively_initialise(&shader_source,this,&local_130,2,&local_b0);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::operator+(&local_d0,&example_structure_definition,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_);
  std::operator+(&shader_source,&local_d0,&base_variable_string);
  std::__cxx11::string::~string((string *)&local_d0);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_15c) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x9fe);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b8cbd5::switchdataD_0171c2e4 +
         (long)(int)(&switchD_00b8cbd5::switchdataD_0171c2e4)[local_158]) {
  case 0xb8cbd7:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb8cbe8:
  case 0xb8cbef:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_0171c2fc + *(int *)(&DAT_0171c2fc + local_158 * 4)))
            (&DAT_0171c2fc + *(int *)(&DAT_0171c2fc + local_158 * 4),empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclStructConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_structure_definition("struct light {\n"
											 "    float intensity;\n"
											 "    int position;\n"
											 "};\n");
	std::string example_structure_object("    light my_light_variable");

	for (size_t max_dimension_index = 2; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string base_variable_string = this->extend_string(example_structure_object, "[]", max_dimension_index);
		base_variable_string += " = ";
		base_variable_string += recursively_initialise("light", max_dimension_index, "1.0, 2");
		base_variable_string += ";\n\n";

		std::string shader_source = example_structure_definition + shader_start + base_variable_string;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 2; ...) */
}